

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

void __thiscall nivalis::Plotter::move_func(Plotter *this,size_t idx,size_t idx_dest)

{
  int iVar1;
  long lVar2;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t j;
  size_t i;
  int64_t step;
  Function *in_stack_000000f8;
  Function *in_stack_00000100;
  size_type local_28;
  
  if (in_RSI != in_RDX) {
    iVar1 = 1;
    if (in_RDX < in_RSI) {
      iVar1 = -1;
    }
    lVar2 = (long)iVar1;
    local_28 = in_RSI;
    if (*(ulong *)(in_RDI + 0x30) == in_RSI) {
      *(ulong *)(in_RDI + 0x30) = in_RDX;
    }
    else if (((in_RSI < *(ulong *)(in_RDI + 0x30)) && (*(ulong *)(in_RDI + 0x30) <= in_RDX)) ||
            ((*(ulong *)(in_RDI + 0x30) < in_RSI && (in_RDX <= *(ulong *)(in_RDI + 0x30))))) {
      *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) - lVar2;
    }
    for (; local_28 != in_RDX; local_28 = lVar2 + local_28) {
      std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)(in_RDI + 0x40),
                 local_28);
      std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)(in_RDI + 0x40),
                 local_28 + lVar2);
      std::swap<nivalis::Function>(in_stack_00000100,in_stack_000000f8);
    }
    *(undefined1 *)(in_RDI + 0xe1) = 1;
  }
  return;
}

Assistant:

void Plotter::move_func(size_t idx, size_t idx_dest) {
    if (idx == idx_dest) return;
    int64_t step = idx > idx_dest ? -1 : 1;
    if (curr_func == idx) curr_func = idx_dest;
    else if (idx < curr_func && curr_func <= idx_dest ||
            idx > curr_func && curr_func >= idx_dest) {
        curr_func -= step;
    }
    for (size_t i = idx; i != idx_dest; i += step) {
        size_t j = i + step;
        std::swap(funcs[i], funcs[j]);
    }
    require_update = true;
}